

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_Value.h
# Opt level: O1

void __thiscall
choc::value::Type::ComplexArray::ComplexArray(ComplexArray *this,Allocator *a,ComplexArray *other)

{
  uint32_t *puVar1;
  Content *pCVar2;
  MainType MVar3;
  uint32_t uVar4;
  uint uVar5;
  RepeatedGroup *pRVar6;
  ComplexArray *other_00;
  Object *other_01;
  ulong uVar7;
  RepeatedGroup *pRVar8;
  Content *pCVar9;
  Object *local_48;
  Object *pOStack_40;
  
  (this->groups).items = (RepeatedGroup *)0x0;
  (this->groups).size = 0;
  (this->groups).capacity = 0;
  (this->groups).allocator = a;
  AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup>::reserve
            (&this->groups,(other->groups).size);
  uVar7 = (ulong)(other->groups).size;
  if (uVar7 != 0) {
    pRVar6 = (other->groups).items;
    pCVar9 = &(pRVar6->elementType).content;
    do {
      uVar4 = *(uint32_t *)(&pCVar9->object + -2);
      MVar3 = (&pCVar9->vector)[-1].elementType;
      if (MVar3 == object) {
        other_01 = pCVar9->object;
        if (a == (Allocator *)0x0) {
          local_48 = (Object *)malloc(0x28);
        }
        else {
          local_48 = (Object *)(**(code **)(*(long *)a + 0x10))(a,0x28);
        }
        Object::Object(local_48,a,other_01);
      }
      else if (MVar3 == complexArray) {
        other_00 = pCVar9->complexArray;
        if (a == (Allocator *)0x0) {
          local_48 = (Object *)malloc(0x18);
        }
        else {
          local_48 = (Object *)(**(code **)(*(long *)a + 0x10))(a,0x18);
        }
        ComplexArray((ComplexArray *)local_48,a,other_00);
      }
      else {
        local_48 = pCVar9->object;
        pOStack_40 = (&pCVar9->object)[1];
      }
      AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup>::reserve
                (&this->groups,(this->groups).size + 1);
      pRVar8 = (this->groups).items;
      uVar5 = (this->groups).size;
      pRVar8[uVar5].repetitions = uVar4;
      pRVar8[uVar5].elementType.mainType = MVar3;
      pCVar2 = &pRVar8[uVar5].elementType.content;
      pCVar2->object = local_48;
      (&pCVar2->object)[1] = pOStack_40;
      pRVar8[uVar5].elementType.allocator = a;
      puVar1 = &(this->groups).size;
      *puVar1 = *puVar1 + 1;
      pRVar8 = (RepeatedGroup *)(&pCVar9->object + 3);
      pCVar9 = (Content *)(&pCVar9->object + 5);
    } while (pRVar8 != pRVar6 + uVar7);
  }
  return;
}

Assistant:

ComplexArray (Allocator* a, const ComplexArray& other) : groups (a)
    {
        groups.reserve (other.groups.size);

        for (auto& g : other.groups)
            groups.push_back ({ a, g });
    }